

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void accumulate(ProcessResult *r,ProcessResult *term)

{
  r->total = r->total + term->total;
  r->replaced_path = r->replaced_path + term->replaced_path;
  r->system_to_user = r->system_to_user + term->system_to_user;
  r->user_to_system = r->user_to_system + term->user_to_system;
  r->untouched = r->untouched + term->untouched;
  r->failed = r->failed + term->failed;
  return;
}

Assistant:

void accumulate(ProcessResult *r, const ProcessResult &term) {
  r->total += term.total;
  r->replaced_path += term.replaced_path;
  r->system_to_user += term.system_to_user;
  r->user_to_system += term.user_to_system;
  r->untouched += term.untouched;
  r->failed += term.failed;
}